

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O2

size_t luaZ_read(ZIO *z,void *b,size_t n)

{
  int iVar1;
  char *__src;
  size_t __n;
  
  do {
    if (n == 0) {
      return 0;
    }
    __n = z->n;
    if (__n == 0) {
      iVar1 = luaZ_fill(z);
      if (iVar1 == -1) {
        return n;
      }
      __n = z->n + 1;
      z->n = __n;
      __src = z->p + -1;
      z->p = __src;
    }
    else {
      __src = z->p;
    }
    if (n < __n) {
      __n = n;
    }
    memcpy(b,__src,__n);
    z->n = z->n - __n;
    z->p = z->p + __n;
    b = (void *)((long)b + __n);
    n = n - __n;
  } while( true );
}

Assistant:

size_t luaZ_read (ZIO *z, void *b, size_t n) {
  while (n) {
    size_t m;
    if (z->n == 0) {  /* no bytes in buffer? */
      if (luaZ_fill(z) == EOZ)  /* try to read more */
        return n;  /* no more input; return number of missing bytes */
      else {
        z->n++;  /* luaZ_fill consumed first byte; put it back */
        z->p--;
      }
    }
    m = (n <= z->n) ? n : z->n;  /* min. between n and z->n */
    memcpy(b, z->p, m);
    z->n -= m;
    z->p += m;
    b = (char *)b + m;
    n -= m;
  }
  return 0;
}